

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dymon.cpp
# Opt level: O1

void log_status(int i,uint8_t *status,uint32_t count)

{
  undefined8 in_RAX;
  ostream *poVar1;
  ulong uVar2;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Status",6);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,i);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," (",2);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"): ",3);
  if (count != 0) {
    uVar2 = 0;
    do {
      uStack_38._0_7_ = CONCAT16("0123456789ABCDEF"[status[uVar2] >> 4],(undefined6)uStack_38);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)((long)&uStack_38 + 6),1);
      uStack_38 = CONCAT17("0123456789ABCDEF"[status[uVar2] & 0xf],(undefined7)uStack_38);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,(char *)((long)&uStack_38 + 7),1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      uVar2 = uVar2 + 1;
    } while (count != uVar2);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  return;
}

Assistant:

static void log_status(int i, const uint8_t * status, uint32_t count)
{
   static const char * const hex = "0123456789ABCDEF";
   std::cout << "Status" << i << " (" << count << "): ";
   for (uint32_t j = 0; j < count; ++j)
   {
      std::cout << hex[(status[j] >> 4)] << hex[(status[j] & 0xF)] << " ";
   }
   std::cout << std::endl;
}